

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

uint64 __thiscall google::protobuf::Arena::ResetInternal(Arena *this)

{
  uint64 uVar1;
  undefined8 *puVar2;
  
  for (puVar2 = *(undefined8 **)(this + 0x20); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)puVar2[2]) {
    (*(code *)puVar2[1])(*puVar2);
  }
  *(undefined8 *)(this + 0x20) = 0;
  uVar1 = FreeBlocks(this);
  if (*(code **)(this + 0x78) != (code *)0x0) {
    (**(code **)(this + 0x78))(this,*(undefined8 *)(this + 0x38),uVar1);
  }
  return uVar1;
}

Assistant:

uint64 Arena::ResetInternal() {
  CleanupList();
  uint64 space_allocated = FreeBlocks();

  // Call the reset hook
  if (options_.on_arena_reset != NULL) {
    options_.on_arena_reset(this, hooks_cookie_, space_allocated);
  }

  return space_allocated;
}